

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s;
  int iVar1;
  istream *piVar2;
  ostream *poVar3;
  size_t sVar4;
  double dVar5;
  undefined1 auVar6 [16];
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  char separator;
  double y;
  double x;
  ifstream file;
  regression<double,_64UL> filter;
  char local_8aa;
  char local_8a9;
  value_type local_8a8;
  value_type local_8a0;
  value_type local_898;
  double local_890 [4];
  byte abStack_870 [488];
  basic_comoment<double,_64UL,_(trial::online::with)2> local_688;
  basic_moment<double,_64UL,_(trial::online::with)2> local_258;
  
  if (argc == 2) {
    memset(&local_688,0,0x400);
    local_688.window.super_span<std::pair<double,_double>,_64UL>.member.size = 0;
    local_688.window.super_span<std::pair<double,_double>,_64UL>.member.next = 0x40;
    local_688.window.super_span<std::pair<double,_double>,_64UL>.member.data = (pointer)&local_688;
    memset(&local_688.sum,0,0x218);
    local_258.super_basic_moment<double,_64UL,_(trial::online::with)1>.member.window.
    super_span<double,_64UL>.member.size = 0;
    local_258.super_basic_moment<double,_64UL,_(trial::online::with)1>.member.window.
    super_span<double,_64UL>.member.next = 0x40;
    local_258.super_basic_moment<double,_64UL,_(trial::online::with)1>.member.mean = 0.0;
    local_258.sum.variance = 0.0;
    local_258.super_basic_moment<double,_64UL,_(trial::online::with)1>.member.window.
    super_span<double,_64UL>.member.data = (pointer)&local_258;
    std::ifstream::ifstream(local_890,argv[1],_S_in);
    if ((abStack_870[*(long *)((long)local_890[0] + -0x18)] & 5) == 0) {
      do {
        piVar2 = std::istream::_M_extract<double>(local_890);
        piVar2 = std::operator>>(piVar2,&local_8a9);
        std::istream::_M_extract<double>((double *)piVar2);
        local_898 = local_8a0;
        trial::online::window::basic_comoment<double,_64UL,_(trial::online::with)2>::push
                  (&local_688,local_8a0,local_8a8);
        trial::online::window::basic_moment<double,_64UL,_(trial::online::with)2>::push
                  (&local_258,local_898);
        poVar3 = std::ostream::_M_insert<double>(local_8a0);
        local_8aa = ',';
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_8aa,1);
        poVar3 = std::ostream::_M_insert<double>(local_8a8);
        local_8aa = ',';
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_8aa,1);
        if (local_258.super_basic_moment<double,_64UL,_(trial::online::with)1>.member.window.
            super_span<double,_64UL>.member.size == 0) {
          dVar5 = 0.0;
        }
        else {
          auVar6._8_4_ = (int)(local_258.super_basic_moment<double,_64UL,_(trial::online::with)1>.
                               member.window.super_span<double,_64UL>.member.size >> 0x20);
          auVar6._0_8_ = local_258.super_basic_moment<double,_64UL,_(trial::online::with)1>.member.
                         window.super_span<double,_64UL>.member.size;
          auVar6._12_4_ = 0x45300000;
          dVar7 = local_258.sum.variance /
                  ((auVar6._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,
                                    (int)local_258.
                                         super_basic_moment<double,_64UL,_(trial::online::with)1>.
                                         member.window.super_span<double,_64UL>.member.size) -
                  4503599627370496.0));
          dVar11 = 0.0;
          dVar5 = 0.0;
          if (0.0 < dVar7) {
            if (local_688.window.super_span<std::pair<double,_double>,_64UL>.member.size != 0) {
              auVar9._8_4_ = (int)(local_688.window.super_span<std::pair<double,_double>,_64UL>.
                                   member.size >> 0x20);
              auVar9._0_8_ = local_688.window.super_span<std::pair<double,_double>,_64UL>.member.
                             size;
              auVar9._12_4_ = 0x45300000;
              dVar11 = (auVar9._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,
                                         (int)local_688.window.
                                              super_span<std::pair<double,_double>,_64UL>.member.
                                              size) - 4503599627370496.0);
              dVar11 = (local_688.sum.xy - (local_688.sum.x * local_688.sum.y) / dVar11) / dVar11;
            }
            dVar5 = dVar11 / dVar7;
          }
        }
        poVar3 = std::ostream::_M_insert<double>(dVar5);
        local_8aa = ',';
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_8aa,1);
        auVar8._8_4_ = (int)(local_688.window.super_span<std::pair<double,_double>,_64UL>.member.
                             size >> 0x20);
        auVar8._0_8_ = local_688.window.super_span<std::pair<double,_double>,_64UL>.member.size;
        auVar8._12_4_ = 0x45300000;
        dVar5 = (auVar8._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,
                                  (int)local_688.window.super_span<std::pair<double,_double>,_64UL>.
                                       member.size) - 4503599627370496.0);
        if (local_258.super_basic_moment<double,_64UL,_(trial::online::with)1>.member.window.
            super_span<double,_64UL>.member.size == 0) {
          dVar11 = 0.0;
        }
        else {
          auVar10._8_4_ =
               (int)(local_258.super_basic_moment<double,_64UL,_(trial::online::with)1>.member.
                     window.super_span<double,_64UL>.member.size >> 0x20);
          auVar10._0_8_ =
               local_258.super_basic_moment<double,_64UL,_(trial::online::with)1>.member.window.
               super_span<double,_64UL>.member.size;
          auVar10._12_4_ = 0x45300000;
          dVar7 = local_258.sum.variance /
                  ((auVar10._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,
                                    (int)local_258.
                                         super_basic_moment<double,_64UL,_(trial::online::with)1>.
                                         member.window.super_span<double,_64UL>.member.size) -
                  4503599627370496.0));
          dVar11 = 0.0;
          if (0.0 < dVar7) {
            if (local_688.window.super_span<std::pair<double,_double>,_64UL>.member.size != 0) {
              dVar11 = (local_688.sum.xy - (local_688.sum.x * local_688.sum.y) / dVar5) / dVar5;
            }
            dVar11 = dVar11 / dVar7;
          }
        }
        poVar3 = std::ostream::_M_insert<double>
                           (local_688.sum.y / dVar5 -
                            dVar11 * local_258.
                                     super_basic_moment<double,_64UL,_(trial::online::with)1>.member
                                     .mean);
        local_8aa = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_8aa,1);
      } while ((abStack_870[*(long *)((long)local_890[0] + -0x18)] & 5) == 0);
    }
    std::ifstream::~ifstream(local_890);
    iVar1 = 0;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Usage: ",7);
    __s = *argv;
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1050b0);
    }
    else {
      sVar4 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," <file>",7);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x50);
    std::ostream::put(-0x50);
    std::ostream::flush();
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int main(int argc, const char *argv[])
{
    if (argc != 2)
    {
        std::cerr << "Usage: " << argv[0] << " <file>" << std::endl;
        return 1;
    }

    window::regression<double, 64> filter;

    double x;
    double y;
    char separator;

    std::ifstream file(argv[1]);
    while (file)
    {
        file >> x >> separator >> y;
        filter.push(x, y);
        std::cout << x << ',' << y << ',' << filter.slope() << ',' << filter.at(0) << '\n';
    }
    return 0;
}